

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# single_particleSpectra.cpp
# Opt level: O0

void __thiscall
singleParticleSpectra::calculate_two_particle_correlation_deltaeta
          (singleParticleSpectra *this,
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          *event_Qn_diff_real,
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          *event_Qn_diff_imag)

{
  double dVar1;
  double dVar2;
  double dVar3;
  undefined1 auVar4 [16];
  int iVar5;
  ulong uVar6;
  void *pvVar7;
  reference pvVar8;
  reference pvVar9;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *in_RDX;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *in_RSI;
  long in_RDI;
  int j_1;
  double QnSP_rap_local;
  int rap_idx;
  int jj;
  int ii;
  int j;
  int i;
  double *temp_corr;
  undefined4 local_44;
  undefined8 local_40;
  undefined4 local_30;
  undefined4 local_2c;
  undefined4 local_28;
  undefined4 local_24;
  
  auVar4._8_8_ = 0;
  auVar4._0_8_ = (long)*(int *)(in_RDI + 0x254);
  uVar6 = SUB168(auVar4 * ZEXT816(8),0);
  if (SUB168(auVar4 * ZEXT816(8),8) != 0) {
    uVar6 = 0xffffffffffffffff;
  }
  pvVar7 = operator_new__(uVar6);
  for (local_24 = 0; local_24 < *(int *)(in_RDI + 0x1c8); local_24 = local_24 + 1) {
    for (local_28 = 0; local_28 < *(int *)(in_RDI + 0x254); local_28 = local_28 + 1) {
      *(undefined8 *)((long)pvVar7 + (long)local_28 * 8) = 0;
    }
    for (local_2c = 0; local_2c < *(int *)(in_RDI + 0x254); local_2c = local_2c + 1) {
      for (local_30 = 0; local_30 < *(int *)(in_RDI + 0x254); local_30 = local_30 + 1) {
        iVar5 = (local_2c - local_30) -
                (int)(*(double *)(in_RDI + 600) / *(double *)(in_RDI + 0x268));
        if ((-1 < iVar5) && (iVar5 < *(int *)(in_RDI + 0x254))) {
          pvVar8 = std::
                   vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   ::operator[](in_RSI,(long)local_2c);
          pvVar9 = std::vector<double,_std::allocator<double>_>::operator[](pvVar8,(long)local_24);
          dVar1 = *pvVar9;
          pvVar8 = std::
                   vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   ::operator[](in_RSI,(long)local_30);
          pvVar9 = std::vector<double,_std::allocator<double>_>::operator[](pvVar8,(long)local_24);
          dVar2 = *pvVar9;
          pvVar8 = std::
                   vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   ::operator[](in_RDX,(long)local_2c);
          pvVar9 = std::vector<double,_std::allocator<double>_>::operator[](pvVar8,(long)local_24);
          dVar3 = *pvVar9;
          pvVar8 = std::
                   vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   ::operator[](in_RDX,(long)local_30);
          pvVar9 = std::vector<double,_std::allocator<double>_>::operator[](pvVar8,(long)local_24);
          local_40 = dVar1 * dVar2 + dVar3 * *pvVar9;
          if (local_2c == local_30) {
            pvVar8 = std::
                     vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                     ::operator[](in_RSI,(long)local_2c);
            pvVar9 = std::vector<double,_std::allocator<double>_>::operator[](pvVar8,0);
            local_40 = local_40 - *pvVar9;
          }
          *(double *)((long)pvVar7 + (long)iVar5 * 8) =
               local_40 + *(double *)((long)pvVar7 + (long)iVar5 * 8);
        }
      }
    }
    for (local_44 = 0; local_44 < *(int *)(in_RDI + 0x254); local_44 = local_44 + 1) {
      dVar1 = *(double *)((long)pvVar7 + (long)local_44 * 8);
      pvVar8 = std::
               vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                             *)(in_RDI + 0x448),(long)local_24);
      pvVar9 = std::vector<double,_std::allocator<double>_>::operator[](pvVar8,(long)local_44);
      *pvVar9 = dVar1 + *pvVar9;
      dVar1 = *(double *)((long)pvVar7 + (long)local_44 * 8);
      dVar2 = *(double *)((long)pvVar7 + (long)local_44 * 8);
      pvVar8 = std::
               vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                             *)(in_RDI + 0x460),(long)local_24);
      pvVar9 = std::vector<double,_std::allocator<double>_>::operator[](pvVar8,(long)local_44);
      *pvVar9 = dVar1 * dVar2 + *pvVar9;
    }
  }
  if (pvVar7 != (void *)0x0) {
    operator_delete__(pvVar7);
  }
  return;
}

Assistant:

void singleParticleSpectra::calculate_two_particle_correlation_deltaeta(
    vector<vector<double>> &event_Qn_diff_real,
    vector<vector<double>> &event_Qn_diff_imag) {
    double *temp_corr = new double[N_rap];
    for (int i = 0; i < order_max; i++) {
        for (int j = 0; j < N_rap; j++) {
            temp_corr[j] = 0.0;
        }
        for (int ii = 0; ii < N_rap; ii++) {
            for (int jj = 0; jj < N_rap; jj++) {
                int rap_idx =
                    ((ii - jj) - static_cast<int>(rapidity_dis_min / drap));
                if (rap_idx >= 0 && rap_idx < N_rap) {
                    double QnSP_rap_local =
                        (event_Qn_diff_real[ii][i] * event_Qn_diff_real[jj][i]
                         + event_Qn_diff_imag[ii][i]
                               * event_Qn_diff_imag[jj][i]);
                    if (ii == jj) {
                        QnSP_rap_local -= event_Qn_diff_real[ii][0];
                    }
                    temp_corr[rap_idx] += QnSP_rap_local;
                }
            }
        }
        for (int j = 0; j < N_rap; j++) {
            QnSP_eta12[i][j] += temp_corr[j];
            QnSP_eta12_err[i][j] += temp_corr[j] * temp_corr[j];
        }
    }
    delete[] temp_corr;
}